

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::lineConstructor<float>(void)

{
  uint32_t uVar1;
  float fVar2;
  float _y;
  LineBase2D<float> *unaff_retaddr;
  LineBase2D<float> line;
  PointBase2D<float> point2;
  PointBase2D<float> point1;
  uint32_t i;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  PointBase2D<float> *in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff8;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar3) break;
    in_stack_ffffffffffffffd0 =
         Unit_Test::randomFloatValue<float>
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    fVar2 = Unit_Test::randomFloatValue<float>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                      );
    PointBase2D<float>::PointBase2D
              ((PointBase2D<float> *)&stack0xfffffffffffffff4,in_stack_ffffffffffffffd0,fVar2);
    fVar2 = Unit_Test::randomFloatValue<float>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                      );
    _y = Unit_Test::randomFloatValue<float>
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    PointBase2D<float>::PointBase2D((PointBase2D<float> *)&stack0xffffffffffffffec,fVar2,_y);
    LineBase2D<float>::LineBase2D
              (unaff_retaddr,(PointBase2D<float> *)CONCAT44(uVar4,in_stack_fffffffffffffff8),
               in_stack_fffffffffffffff0);
    uVar3 = uVar4 + 1;
  }
  return true;
}

Assistant:

bool lineConstructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line( point1, point2 );
        }
        return true;
    }